

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall
cmGraphVizWriter::cmGraphVizWriter
          (cmGraphVizWriter *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *localGenerators)

{
  _Rb_tree_header *p_Var1;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  
  std::__cxx11::string::string((string *)this,"digraph",&local_21);
  std::__cxx11::string::string((string *)&this->GraphName,"GG",&local_22);
  std::__cxx11::string::string
            ((string *)&this->GraphHeader,"node [\n  fontsize = \"12\"\n];",&local_23);
  std::__cxx11::string::string((string *)&this->GraphNodePrefix,"node",&local_24);
  (this->TargetsToIgnoreRegex).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TargetsToIgnoreRegex).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TargetsToIgnoreRegex).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->LocalGenerators = localGenerators;
  p_Var1 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header;
  (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->TargetNamesNodes)._M_t._M_impl.super__Rb_tree_header;
  (this->TargetNamesNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TargetNamesNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TargetNamesNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->TargetNamesNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->TargetNamesNodes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->GenerateForExecutables = true;
  this->GenerateForStaticLibs = true;
  this->GenerateForSharedLibs = true;
  this->GenerateForModuleLibs = true;
  this->GenerateForModuleLibs = true;
  this->GenerateForExternals = true;
  this->GeneratePerTarget = true;
  this->GenerateDependers = true;
  this->HaveTargetsAndLibs = false;
  return;
}

Assistant:

cmGraphVizWriter::cmGraphVizWriter(const std::vector<cmLocalGenerator*>&
                                                               localGenerators)
:GraphType("digraph")
,GraphName("GG")
,GraphHeader("node [\n  fontsize = \"12\"\n];")
,GraphNodePrefix("node")
,LocalGenerators(localGenerators)
,GenerateForExecutables(true)
,GenerateForStaticLibs(true)
,GenerateForSharedLibs(true)
,GenerateForModuleLibs(true)
,GenerateForExternals(true)
,GeneratePerTarget(true)
,GenerateDependers(true)
,HaveTargetsAndLibs(false)
{
}